

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timers.cpp
# Opt level: O0

timer_thread_unique_ptr_t __thiscall
so_5::create_timer_list_thread(so_5 *this,error_logger_shptr_t *logger)

{
  timer_list_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
  *this_00;
  actual_thread_t<timertt::timer_list_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
  *this_01;
  error_logger_shptr_t *logger_00;
  unique_ptr<timertt::timer_list_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_std::default_delete<timertt::timer_list_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_>
  local_a0;
  undefined1 local_91;
  shared_ptr<so_5::error_logger_t> local_90;
  exception_handler_for_timertt_t local_80;
  shared_ptr<so_5::error_logger_t> local_50;
  error_logger_for_timertt_t local_40;
  unique_ptr<timertt::timer_list_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_std::default_delete<timertt::timer_list_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_>
  local_20;
  unique_ptr<timertt::timer_list_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_std::default_delete<timertt::timer_list_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_>
  thread;
  error_logger_shptr_t *logger_local;
  
  thread._M_t.
  super___uniq_ptr_impl<timertt::timer_list_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_std::default_delete<timertt::timer_list_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_timertt::timer_list_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_*,_std::default_delete<timertt::timer_list_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_>
  .
  super__Head_base<0UL,_timertt::timer_list_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<timertt::timer_list_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_std::default_delete<timertt::timer_list_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>,_true,_true>
        )(__uniq_ptr_data<timertt::timer_list_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_std::default_delete<timertt::timer_list_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>,_true,_true>
          )logger;
  this_00 = (timer_list_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
             *)operator_new(0xd0);
  local_91 = 1;
  std::shared_ptr<so_5::error_logger_t>::shared_ptr(&local_50,logger);
  timers_details::create_error_logger_for_timertt_abi_cxx11_
            (&local_40,(timers_details *)&local_50,logger_00);
  std::shared_ptr<so_5::error_logger_t>::shared_ptr(&local_90,logger);
  timers_details::create_exception_handler_for_timertt_thread(&local_80,&local_90);
  timertt::
  timer_list_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
  ::timer_list_thread_template(this_00,&local_40,&local_80);
  local_91 = 0;
  std::
  unique_ptr<timertt::timer_list_thread_template<std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,std::default_delete<timertt::timer_list_thread_template<std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>>>
  ::
  unique_ptr<std::default_delete<timertt::timer_list_thread_template<std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>>,void>
            ((unique_ptr<timertt::timer_list_thread_template<std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,std::default_delete<timertt::timer_list_thread_template<std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>>>
              *)&local_20,this_00);
  std::function<void_(const_std::exception_&)>::~function(&local_80);
  std::shared_ptr<so_5::error_logger_t>::~shared_ptr(&local_90);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_40);
  std::shared_ptr<so_5::error_logger_t>::~shared_ptr(&local_50);
  this_01 = (actual_thread_t<timertt::timer_list_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
             *)operator_new(0x10);
  std::
  unique_ptr<timertt::timer_list_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_std::default_delete<timertt::timer_list_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_>
  ::unique_ptr(&local_a0,&local_20);
  timers_details::
  actual_thread_t<timertt::timer_list_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>
  ::actual_thread_t(this_01,&local_a0);
  std::unique_ptr<so_5::timer_thread_t,std::default_delete<so_5::timer_thread_t>>::
  unique_ptr<std::default_delete<so_5::timer_thread_t>,void>
            ((unique_ptr<so_5::timer_thread_t,std::default_delete<so_5::timer_thread_t>> *)this,
             (pointer)this_01);
  std::
  unique_ptr<timertt::timer_list_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_std::default_delete<timertt::timer_list_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_>
  ::~unique_ptr(&local_a0);
  std::
  unique_ptr<timertt::timer_list_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>,_std::default_delete<timertt::timer_list_thread_template<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>_>_>
  ::~unique_ptr(&local_20);
  return (__uniq_ptr_data<so_5::timer_thread_t,_std::default_delete<so_5::timer_thread_t>,_true,_true>
          )(__uniq_ptr_data<so_5::timer_thread_t,_std::default_delete<so_5::timer_thread_t>,_true,_true>
            )this;
}

Assistant:

SO_5_FUNC timer_thread_unique_ptr_t
create_timer_list_thread(
	error_logger_shptr_t logger )
	{
		using timertt_thread_t = timers_details::timer_list_thread_t;
		using namespace timers_details;

		std::unique_ptr< timertt_thread_t > thread(
				new timertt_thread_t(
						create_error_logger_for_timertt( logger ),
						create_exception_handler_for_timertt_thread( logger ) ) );

		return timer_thread_unique_ptr_t(
				new actual_thread_t< timertt_thread_t >( std::move( thread ) ) );
	}